

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<std::complex<float>,_10> * __thiscall
TPZManVector<std::complex<float>,_10>::operator=
          (TPZManVector<std::complex<float>,_10> *this,TPZManVector<std::complex<float>,_10> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  complex<float> *pcVar4;
  TPZManVector<std::complex<float>,_10> *in_RSI;
  TPZManVector<std::complex<float>,_10> *in_RDI;
  int64_t i;
  int64_t nel;
  complex<float> *local_68;
  long local_30;
  
  if (in_RDI != in_RSI) {
    uVar2 = TPZVec<std::complex<float>_>::NElements(&in_RSI->super_TPZVec<std::complex<float>_>);
    if ((((in_RDI->super_TPZVec<std::complex<float>_>).fNAlloc < (long)uVar2) &&
        ((in_RDI->super_TPZVec<std::complex<float>_>).fStore != (complex<float> *)0x0)) &&
       ((in_RDI->super_TPZVec<std::complex<float>_>).fStore != in_RDI->fExtAlloc)) {
      pcVar4 = (in_RDI->super_TPZVec<std::complex<float>_>).fStore;
      if (pcVar4 != (complex<float> *)0x0) {
        operator_delete__(pcVar4);
      }
      (in_RDI->super_TPZVec<std::complex<float>_>).fStore = (complex<float> *)0x0;
      (in_RDI->super_TPZVec<std::complex<float>_>).fNAlloc = 0;
    }
    if ((long)uVar2 < 0xb) {
      if (((in_RDI->super_TPZVec<std::complex<float>_>).fStore != in_RDI->fExtAlloc) &&
         (pcVar4 = (in_RDI->super_TPZVec<std::complex<float>_>).fStore,
         pcVar4 != (complex<float> *)0x0)) {
        operator_delete__(pcVar4);
      }
      (in_RDI->super_TPZVec<std::complex<float>_>).fNAlloc = 0;
      (in_RDI->super_TPZVec<std::complex<float>_>).fStore = in_RDI->fExtAlloc;
      (in_RDI->super_TPZVec<std::complex<float>_>).fNElements = uVar2;
    }
    else if ((in_RDI->super_TPZVec<std::complex<float>_>).fNAlloc < (long)uVar2) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2;
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pcVar4 = (complex<float> *)operator_new__(uVar3);
      if (uVar2 != 0) {
        local_68 = pcVar4;
        do {
          std::complex<float>::complex(local_68,0.0,0.0);
          local_68 = local_68 + 1;
        } while (local_68 != pcVar4 + uVar2);
      }
      (in_RDI->super_TPZVec<std::complex<float>_>).fStore = pcVar4;
      (in_RDI->super_TPZVec<std::complex<float>_>).fNAlloc = uVar2;
      (in_RDI->super_TPZVec<std::complex<float>_>).fNElements = uVar2;
    }
    else {
      (in_RDI->super_TPZVec<std::complex<float>_>).fNElements = uVar2;
    }
    for (local_30 = 0; local_30 < (long)uVar2; local_30 = local_30 + 1) {
      (in_RDI->super_TPZVec<std::complex<float>_>).fStore[local_30]._M_value =
           (in_RSI->super_TPZVec<std::complex<float>_>).fStore[local_30]._M_value;
    }
  }
  return in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}